

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O2

void __thiscall CDT::set(CDT *this,DataSet *dataset,uint n_input,bool dc_sort)

{
  undefined3 in_register_00000009;
  double dVar1;
  Shape SVar2;
  vector<Matrix<double>,_std::allocator<Matrix<double>_>_> matrices;
  
  DataSet::operator=(&this->m_dataset,dataset);
  std::vector<Layer,_std::allocator<Layer>_>::resize(&this->m_layers,3);
  SVar2 = DataSet::shape(dataset);
  dVar1 = DataSet::biased(&this->m_dataset);
  (this->m_info).bias = dVar1;
  if (CONCAT31(in_register_00000009,dc_sort) != 0) {
    DataSet::dc_sort(&this->m_dataset);
  }
  DataSet::compile(&matrices,&this->m_dataset,SVar2.n_col - n_input);
  Matrix<double>::operator=
            (&this->m_input,
             matrices.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
             super__Vector_impl_data._M_start);
  Matrix<double>::operator=
            (&this->m_output,
             matrices.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
             super__Vector_impl_data._M_start + 1);
  std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::~vector(&matrices);
  return;
}

Assistant:

void CDT::set(const DataSet& dataset, unsigned n_input, bool dc_sort){
    m_dataset=dataset;
    m_layers.resize(3);
    
    unsigned n_output=dataset.shape().n_col-n_input;
    m_info.bias=m_dataset.biased();
    if(dc_sort) m_dataset.dc_sort();

    std::vector<Matrix_d> matrices=m_dataset.compile(n_output);
    m_input=matrices[0];
    m_output=matrices[1];
}